

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_mul(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  value_type pLVar4;
  pointer piVar5;
  long lVar6;
  FILE *__stream;
  bool bVar7;
  int iVar8;
  size_type sVar9;
  reference ppLVar10;
  reference pvVar11;
  size_type sVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  reference pvVar15;
  int iVar16;
  long in_RDI;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_1;
  float *bias;
  float *weight;
  int weight_per_outch;
  int channels;
  MemoryData *memorydata;
  size_t k;
  BinaryOp *binaryop;
  ConvolutionDepthWise *convolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_a4;
  int local_94;
  size_type local_70;
  size_type local_58;
  size_type local_48;
  
  sVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_48 = 0;
  do {
    if (sVar9 <= local_48) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_48);
    bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff28);
    if (!bVar7) {
      ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_48);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar10)->tops,0);
      iVar1 = *pvVar11;
      local_58 = local_48;
      do {
        do {
          do {
            local_58 = local_58 + 1;
            if (sVar9 <= local_58) goto LAB_001786e8;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_58);
            bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                                    ,in_stack_ffffffffffffff28);
          } while (bVar7);
          ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_58);
          sVar12 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar10)->bottoms);
        } while (sVar12 != 2);
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_58);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar10)->bottoms,0);
      } while (*pvVar11 != iVar1);
LAB_001786e8:
      if (local_58 != sVar9) {
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_48);
        pLVar2 = *ppLVar10;
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_58);
        pLVar3 = *ppLVar10;
        if ((*(int *)&pLVar3[1]._vptr_Layer == 2) &&
           (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
          for (local_70 = 0; local_70 < local_58; local_70 = local_70 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_70);
            bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                                    ,in_stack_ffffffffffffff28);
            if (!bVar7) {
              ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_70);
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar10)->tops,0);
              iVar1 = *pvVar11;
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->bottoms,1);
              if (iVar1 == *pvVar11) break;
            }
          }
          if (local_70 != local_58) {
            ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_70);
            __stream = _stderr;
            pLVar4 = *ppLVar10;
            iVar1 = *(int *)&pLVar2[1]._vptr_Layer;
            if (((*(int *)&pLVar4[1]._vptr_Layer == iVar1) &&
                (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0)) &&
               (iVar8._0_1_ = pLVar4[1].support_bf16_storage,
               iVar8._1_1_ = pLVar4[1].support_fp16_storage,
               iVar8._2_1_ = pLVar4[1].support_int8_storage,
               iVar8._3_1_ = pLVar4[1].support_image_storage, iVar8 == 0)) {
              uVar13 = std::__cxx11::string::c_str();
              uVar14 = std::__cxx11::string::c_str();
              fprintf(__stream,"fuse_convolutiondepthwise_mul %s %s\n",uVar13,uVar14);
              iVar8 = *(int *)&pLVar2[1].type.field_0x4 / iVar1;
              piVar5 = pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              lVar6 = *(long *)&pLVar2[2].support_tensor_storage;
              for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 1) {
                iVar16 = iVar8 * local_94;
                for (local_a4 = 0; local_a4 < iVar8; local_a4 = local_a4 + 1) {
                  piVar5[(long)iVar16 + (long)local_a4] =
                       (int)(*(float *)(*(long *)&pLVar4[1].support_tensor_storage +
                                       (long)local_94 * 4) *
                            (float)piVar5[(long)iVar16 + (long)local_a4]);
                }
                if (lVar6 != 0) {
                  *(float *)(lVar6 + (long)local_94 * 4) =
                       *(float *)(lVar6 + (long)local_94 * 4) *
                       *(float *)(*(long *)&pLVar4[1].support_tensor_storage + (long)local_94 * 4);
                }
              }
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
              iVar1 = *pvVar11;
              in_stack_ffffffffffffff30 = iVar1;
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
              *pvVar11 = in_stack_ffffffffffffff30;
              in_stack_ffffffffffffff34 = (int)local_48;
              pvVar15 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                  (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)
                                    (in_RDI + 0x50),(long)iVar1);
              pvVar15->producer = in_stack_ffffffffffffff34;
              std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
            }
          }
        }
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_mul()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BinaryOp to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 2 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolutiondepthwise->num_output;

        if (memorydata->w != channels || memorydata->h != 0 || memorydata->c != 0)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolutiondepthwise_mul %s %s\n", convolutiondepthwise->name.c_str(), binaryop->name.c_str());

        {
            const int weight_per_outch = convolutiondepthwise->weight_data_size / channels;

            float* weight = convolutiondepthwise->weight_data;
            float* bias = convolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= memorydata->data[i];
                }

                if (bias)
                {
                    bias[i] = bias[i] * memorydata->data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}